

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_AddAnonLabel(void)

{
  char local_118 [8];
  char name [256];
  Symbol *local_10;
  
  if (anonLabelID == 0xffffffff) {
    error("Only %u anonymous labels can be created!",0xffffffff);
    local_10 = (Symbol *)0x0;
  }
  else {
    sym_WriteAnonLabelName(local_118,0,true);
    anonLabelID = anonLabelID + 1;
    local_10 = addLabel(local_118);
  }
  return local_10;
}

Assistant:

struct Symbol *sym_AddAnonLabel(void)
{
	if (anonLabelID == UINT32_MAX) {
		error("Only %" PRIu32 " anonymous labels can be created!", anonLabelID);
		return NULL;
	}
	char name[MAXSYMLEN + 1];

	sym_WriteAnonLabelName(name, 0, true); // The direction is important!
	anonLabelID++;
	return addLabel(name);
}